

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O2

void Ssw_MatchingExtend(Aig_Man_t *p0,Aig_Man_t *p1,int nDist,int fVerbose)

{
  Aig_Obj_t *pAVar1;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  void *pvVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Aig_Man_t *pAVar8;
  int iVar9;
  
  Aig_ManFanoutStart(p0);
  Aig_ManFanoutStart(p1);
  p = Vec_PtrAlloc(1000);
  p_00 = Vec_PtrAlloc(1000);
  if (fVerbose != 0) {
    pAVar8 = p0;
    uVar2 = Ssw_MatchingCountUnmached(p0);
    iVar7 = (int)pAVar8;
    Abc_Print(iVar7,"Extending islands by %d steps:\n",(ulong)(uint)nDist);
    uVar5 = p0->nObjs[5] + p0->nObjs[2] + p0->nObjs[6];
    Abc_Print(iVar7,"%2d : Total = %6d. Unmatched = %6d.  Ratio = %6.2f %%\n",
              ((double)(int)uVar2 * 100.0) / (double)(int)uVar5,0,(ulong)uVar5,(ulong)uVar2);
  }
  uVar2 = 0;
  if (nDist < 1) {
    nDist = 0;
  }
  do {
    if (uVar2 == nDist) {
      Vec_PtrFree(p);
      Vec_PtrFree(p_00);
      Aig_ManFanoutStop(p0);
      Aig_ManFanoutStop(p1);
      return;
    }
    Ssw_MatchingExtendOne(p0,p);
    Ssw_MatchingExtendOne(p1,p_00);
    iVar9 = 0;
    iVar7 = p->nSize;
    if (p->nSize < 1) {
      iVar7 = iVar9;
    }
    for (; iVar7 != iVar9; iVar9 = iVar9 + 1) {
      pvVar4 = Vec_PtrEntry(p,iVar9);
      pAVar1 = *(Aig_Obj_t **)((long)pvVar4 + 0x28);
      if (pAVar1 != (Aig_Obj_t *)0x0) {
        if ((pAVar1->field_5).pData != pvVar4) {
          __assert_fail("pNext1->pData == pNext0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswIslands.c"
                        ,0xf5,"void Ssw_MatchingExtend(Aig_Man_t *, Aig_Man_t *, int, int)");
        }
        iVar3 = Saig_ObjIsPi(p0,pAVar1);
        if (iVar3 == 0) {
          *(undefined8 *)((long)pvVar4 + 0x28) = 0;
          (pAVar1->field_5).pData = (void *)0x0;
        }
      }
    }
    iVar9 = 0;
    iVar7 = p_00->nSize;
    if (p_00->nSize < 1) {
      iVar7 = iVar9;
    }
    for (; iVar7 != iVar9; iVar9 = iVar9 + 1) {
      pvVar4 = Vec_PtrEntry(p_00,iVar9);
      pAVar1 = *(Aig_Obj_t **)((long)pvVar4 + 0x28);
      if (pAVar1 != (Aig_Obj_t *)0x0) {
        if ((pAVar1->field_5).pData != pvVar4) {
          __assert_fail("pNext1->pData == pNext0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswIslands.c"
                        ,0x100,"void Ssw_MatchingExtend(Aig_Man_t *, Aig_Man_t *, int, int)");
        }
        iVar3 = Saig_ObjIsPi(p1,pAVar1);
        if (iVar3 == 0) {
          *(undefined8 *)((long)pvVar4 + 0x28) = 0;
          (pAVar1->field_5).pData = (void *)0x0;
        }
      }
    }
    if (fVerbose == 0) {
      uVar2 = uVar2 + 1;
    }
    else {
      pAVar8 = p0;
      uVar5 = Ssw_MatchingCountUnmached(p0);
      uVar2 = uVar2 + 1;
      uVar6 = p0->nObjs[5] + p0->nObjs[2] + p0->nObjs[6];
      Abc_Print((int)pAVar8,"%2d : Total = %6d. Unmatched = %6d.  Ratio = %6.2f %%\n",
                ((double)(int)uVar5 * 100.0) / (double)(int)uVar6,(ulong)uVar2,(ulong)uVar6,
                (ulong)uVar5);
    }
  } while( true );
}

Assistant:

void Ssw_MatchingExtend( Aig_Man_t * p0, Aig_Man_t * p1, int nDist, int fVerbose )
{
    Vec_Ptr_t * vNodes0, * vNodes1;
    Aig_Obj_t * pNext0, * pNext1;
    int d, k;
    Aig_ManFanoutStart(p0);
    Aig_ManFanoutStart(p1);
    vNodes0 = Vec_PtrAlloc( 1000 );
    vNodes1 = Vec_PtrAlloc( 1000 );
    if ( fVerbose )
    {
        int nUnmached = Ssw_MatchingCountUnmached(p0);
        Abc_Print( 1, "Extending islands by %d steps:\n", nDist );
        Abc_Print( 1, "%2d : Total = %6d. Unmatched = %6d.  Ratio = %6.2f %%\n",
            0, Aig_ManCiNum(p0) + Aig_ManNodeNum(p0),
            nUnmached, 100.0 * nUnmached/(Aig_ManCiNum(p0) + Aig_ManNodeNum(p0)) );
    }
    for ( d = 0; d < nDist; d++ )
    {
        Ssw_MatchingExtendOne( p0, vNodes0 );
        Ssw_MatchingExtendOne( p1, vNodes1 );
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes0, pNext0, k )
        {
            pNext1 = (Aig_Obj_t *)pNext0->pData;
            if ( pNext1 == NULL )
                continue;
            assert( pNext1->pData == pNext0 );
            if ( Saig_ObjIsPi(p0, pNext1) )
                continue;
            pNext0->pData = NULL;
            pNext1->pData = NULL;
        }
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes1, pNext0, k )
        {
            pNext1 = (Aig_Obj_t *)pNext0->pData;
            if ( pNext1 == NULL )
                continue;
            assert( pNext1->pData == pNext0 );
            if ( Saig_ObjIsPi(p1, pNext1) )
                continue;
            pNext0->pData = NULL;
            pNext1->pData = NULL;
        }
        if ( fVerbose )
        {
            int nUnmached = Ssw_MatchingCountUnmached(p0);
            Abc_Print( 1, "%2d : Total = %6d. Unmatched = %6d.  Ratio = %6.2f %%\n",
                d+1, Aig_ManCiNum(p0) + Aig_ManNodeNum(p0),
                nUnmached, 100.0 * nUnmached/(Aig_ManCiNum(p0) + Aig_ManNodeNum(p0)) );
        }
    }
    Vec_PtrFree( vNodes0 );
    Vec_PtrFree( vNodes1 );
    Aig_ManFanoutStop(p0);
    Aig_ManFanoutStop(p1);
}